

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satUtil.c
# Opt level: O2

void Sat_Solver2PrintStats(FILE *pFile,sat_solver2 *s)

{
  printf("starts        : %10d\n",(ulong)(s->stats).starts);
  printf("conflicts     : %10d\n",(ulong)(uint)(s->stats).conflicts);
  printf("decisions     : %10d\n",(ulong)(uint)(s->stats).decisions);
  printf("propagations  : %10d\n",(ulong)(uint)(s->stats).propagations);
  return;
}

Assistant:

void Sat_Solver2PrintStats( FILE * pFile, sat_solver2 * s )
{
    printf( "starts        : %10d\n", (int)s->stats.starts );
    printf( "conflicts     : %10d\n", (int)s->stats.conflicts );
    printf( "decisions     : %10d\n", (int)s->stats.decisions );
    printf( "propagations  : %10d\n", (int)s->stats.propagations );
//    printf( "inspects      : %10d\n", (int)s->stats.inspects );
//    printf( "inspects2     : %10d\n", (int)s->stats.inspects2 );
/*
    printf( "memory for variables %.1f MB (free %6.2f %%) and clauses %.1f MB (free %6.2f %%)\n", 
        1.0 * Sat_Solver2GetVarMem(s) * s->size / (1<<20),
        100.0 * (s->cap - s->size) / s->cap,
        4.0 * (s->clauses.cap + s->learnts.cap) / (1<<20),
        100.0 * (s->clauses.cap - s->clauses.size + 
                 s->learnts.cap - s->learnts.size) / 
                (s->clauses.cap + s->learnts.cap) );
*/
}